

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_circuit.cpp
# Opt level: O2

SimComponent * __thiscall lsim::SimCircuit::add_component(SimCircuit *this,ModelComponent *comp)

{
  Simulator *pSVar1;
  unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_> uVar2;
  pin_t pVar3;
  pin_t pVar4;
  uint uVar5;
  SimComponent *this_00;
  mapped_type *ppSVar6;
  pin_id_t pVar7;
  size_t sVar8;
  unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_> nested_instance;
  unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_> local_38;
  
  if (comp != (ModelComponent *)0x0) {
    this_00 = Simulator::create_component(this->m_sim,comp);
    nested_instance._M_t.
    super___uniq_ptr_impl<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>._M_t.
    super__Tuple_impl<0UL,_lsim::SimCircuit_*,_std::default_delete<lsim::SimCircuit>_>.
    super__Head_base<0UL,_lsim::SimCircuit_*,_false>._M_head_impl._0_4_ = comp->m_id;
    ppSVar6 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_lsim::SimComponent_*>,_std::allocator<std::pair<const_unsigned_int,_lsim::SimComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_lsim::SimComponent_*>,_std::allocator<std::pair<const_unsigned_int,_lsim::SimComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->m_components,(key_type *)&nested_instance);
    *ppSVar6 = this_00;
    if (comp->m_type == 0x301) {
      ModelCircuit::instantiate
                ((ModelCircuit *)&nested_instance,(Simulator *)comp->m_nested_circuit,
                 SUB81(this->m_sim,0));
      build_name((SimCircuit *)
                 nested_instance._M_t.
                 super___uniq_ptr_impl<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_lsim::SimCircuit_*,_std::default_delete<lsim::SimCircuit>_>.
                 super__Head_base<0UL,_lsim::SimCircuit_*,_false>._M_head_impl,comp->m_id);
      sVar8 = 0;
      while( true ) {
        uVar2._M_t.super___uniq_ptr_impl<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>.
        _M_t.super__Tuple_impl<0UL,_lsim::SimCircuit_*,_std::default_delete<lsim::SimCircuit>_>.
        super__Head_base<0UL,_lsim::SimCircuit_*,_false>._M_head_impl =
             nested_instance._M_t.
             super___uniq_ptr_impl<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>._M_t.
             super__Tuple_impl<0UL,_lsim::SimCircuit_*,_std::default_delete<lsim::SimCircuit>_>.
             super__Head_base<0UL,_lsim::SimCircuit_*,_false>._M_head_impl;
        uVar5 = this_00->m_output_start;
        if (uVar5 <= (uint)sVar8) break;
        pVar7 = ModelCircuit::port_by_index(comp->m_nested_circuit,true,sVar8);
        pVar3 = pin_from_pin_id((SimCircuit *)
                                uVar2._M_t.
                                super___uniq_ptr_impl<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_lsim::SimCircuit_*,_std::default_delete<lsim::SimCircuit>_>
                                .super__Head_base<0UL,_lsim::SimCircuit_*,_false>._M_head_impl,pVar7
                               );
        pSVar1 = this->m_sim;
        pVar4 = SimComponent::pin_by_index(this_00,(uint)sVar8);
        Simulator::connect_pins(pSVar1,pVar3,pVar4);
        sVar8 = sVar8 + 1;
      }
      for (sVar8 = 0;
          uVar2._M_t.super___uniq_ptr_impl<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>
          ._M_t.super__Tuple_impl<0UL,_lsim::SimCircuit_*,_std::default_delete<lsim::SimCircuit>_>.
          super__Head_base<0UL,_lsim::SimCircuit_*,_false>._M_head_impl =
               nested_instance._M_t.
               super___uniq_ptr_impl<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>._M_t.
               super__Tuple_impl<0UL,_lsim::SimCircuit_*,_std::default_delete<lsim::SimCircuit>_>.
               super__Head_base<0UL,_lsim::SimCircuit_*,_false>._M_head_impl,
          (uint)sVar8 < this_00->m_control_start - uVar5; sVar8 = sVar8 + 1) {
        pVar7 = ModelCircuit::port_by_index(comp->m_nested_circuit,false,sVar8);
        pVar3 = pin_from_pin_id((SimCircuit *)
                                uVar2._M_t.
                                super___uniq_ptr_impl<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_lsim::SimCircuit_*,_std::default_delete<lsim::SimCircuit>_>
                                .super__Head_base<0UL,_lsim::SimCircuit_*,_false>._M_head_impl,pVar7
                               );
        pSVar1 = this->m_sim;
        pVar4 = SimComponent::pin_by_index(this_00,this_00->m_output_start + (uint)sVar8);
        Simulator::connect_pins(pSVar1,pVar3,pVar4);
        uVar5 = this_00->m_output_start;
      }
      local_38 = (unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>)
                 (unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>)
                 nested_instance._M_t.
                 super___uniq_ptr_impl<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_lsim::SimCircuit_*,_std::default_delete<lsim::SimCircuit>_>.
                 super__Head_base<0UL,_lsim::SimCircuit_*,_false>._M_head_impl;
      nested_instance._M_t.
      super___uniq_ptr_impl<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>._M_t.
      super__Tuple_impl<0UL,_lsim::SimCircuit_*,_std::default_delete<lsim::SimCircuit>_>.
      super__Head_base<0UL,_lsim::SimCircuit_*,_false>._M_head_impl =
           (__uniq_ptr_data<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>,_true,_true>)
           (__uniq_ptr_impl<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>)0x0;
      SimComponent::set_nested_instance(this_00,&local_38);
      std::unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>::~unique_ptr
                (&local_38);
      std::unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>::~unique_ptr
                (&nested_instance);
    }
    return this_00;
  }
  __assert_fail("comp",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                ,0x16,"SimComponent *lsim::SimCircuit::add_component(ModelComponent *)");
}

Assistant:

SimComponent *SimCircuit::add_component(ModelComponent *comp) {
    assert(comp);
    auto sim_comp = m_sim->create_component(comp);
    m_components[comp->id()] = sim_comp;

    if (comp->type() == COMPONENT_SUB_CIRCUIT) {
        auto nested_instance = comp->nested_circuit()->instantiate(m_sim, false);
        nested_instance->build_name(comp->id());

        for (auto idx = 0u; idx < sim_comp->num_inputs(); ++idx) {
            auto nested_pin = nested_instance->pin_from_pin_id(comp->nested_circuit()->port_by_index(true, idx));
            m_sim->connect_pins(nested_pin, sim_comp->pin_by_index(sim_comp->input_pin_index(idx)));
        }        

        for (auto idx = 0u; idx < sim_comp->num_outputs(); ++idx) {
            auto nested_pin = nested_instance->pin_from_pin_id(comp->nested_circuit()->port_by_index(false, idx));
            m_sim->connect_pins(nested_pin, sim_comp->pin_by_index(sim_comp->output_pin_index(idx)));
        }        

        sim_comp->set_nested_instance(std::move(nested_instance));
    }
    return sim_comp;
}